

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_special_cmd(mainchan *mc,SessionSpecialCode code,int arg)

{
  PacketProtocolLayer *pPVar1;
  LogContext *ctx;
  char *pcVar2;
  char *signame;
  PacketProtocolLayer *ppl;
  int arg_local;
  SessionSpecialCode code_local;
  mainchan *mc_local;
  
  pPVar1 = mc->ppl;
  if (code == SS_EOF) {
    if ((mc->ready & 1U) == 0) {
      mc->eof_pending = true;
    }
    else if ((mc->eof_sent & 1U) == 0) {
      sshfwd_write_eof(mc->sc);
      mc->eof_sent = true;
    }
  }
  else if (code == SS_BRK) {
    sshfwd_send_serial_break(mc->sc,false,0);
  }
  else {
    pcVar2 = ssh_signal_lookup(code);
    if (pcVar2 != (char *)0x0) {
      sshfwd_send_signal(mc->sc,false,pcVar2);
      ctx = pPVar1->logctx;
      pcVar2 = dupprintf("Sent signal SIG%s",pcVar2);
      logevent_and_free(ctx,pcVar2);
    }
  }
  return;
}

Assistant:

void mainchan_special_cmd(mainchan *mc, SessionSpecialCode code, int arg)
{
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */
    const char *signame;

    if (code == SS_EOF) {
        if (!mc->ready) {
            /*
             * Buffer the EOF to send as soon as the main channel is
             * fully set up.
             */
            mc->eof_pending = true;
        } else if (!mc->eof_sent) {
            sshfwd_write_eof(mc->sc);
            mc->eof_sent = true;
        }
    } else if (code == SS_BRK) {
        sshfwd_send_serial_break(
            mc->sc, false, 0 /* default break length */);
    } else if ((signame = ssh_signal_lookup(code)) != NULL) {
        /* It's a signal. */
        sshfwd_send_signal(mc->sc, false, signame);
        ppl_logevent("Sent signal SIG%s", signame);
    }
}